

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

bool deqp::gles2::Functional::compareToConstantColor
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *result,
               CompareLogMode logMode,RGBA color)

{
  Surface *pSVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  MessageBuilder *this;
  TestLog *pTVar6;
  bool bVar7;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  LogImage local_470;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  LogImageSet local_390;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  LogImage local_300;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  LogImageSet local_220;
  MessageBuilder local_1d0;
  RGBA local_50;
  RGBA local_4c;
  RGBA local_48;
  RGBA local_44;
  int local_40;
  int local_3c;
  int x;
  int y;
  bool isOk;
  Surface *pSStack_30;
  CompareLogMode logMode_local;
  Surface *result_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  RGBA color_local;
  
  x._3_1_ = 1;
  y = logMode;
  pSStack_30 = result;
  result_local = (Surface *)imageSetDesc;
  imageSetDesc_local = imageSetName;
  imageSetName_local = (char *)log;
  log_local._4_4_ = color.m_value;
  for (local_3c = 0; iVar5 = local_3c, iVar4 = tcu::Surface::getHeight(pSStack_30),
      pcVar3 = imageSetName_local, pcVar2 = imageSetDesc_local, iVar5 < iVar4;
      local_3c = local_3c + 1) {
    for (local_40 = 0; iVar5 = local_40, iVar4 = tcu::Surface::getWidth(pSStack_30), iVar5 < iVar4;
        local_40 = local_40 + 1) {
      local_44 = tcu::Surface::getPixel(pSStack_30,local_40,local_3c);
      iVar5 = tcu::RGBA::getRed(&local_44);
      iVar4 = tcu::RGBA::getRed((RGBA *)((long)&log_local + 4));
      bVar7 = true;
      if (iVar5 == iVar4) {
        local_48 = tcu::Surface::getPixel(pSStack_30,local_40,local_3c);
        iVar5 = tcu::RGBA::getGreen(&local_48);
        iVar4 = tcu::RGBA::getGreen((RGBA *)((long)&log_local + 4));
        bVar7 = true;
        if (iVar5 == iVar4) {
          local_4c = tcu::Surface::getPixel(pSStack_30,local_40,local_3c);
          iVar5 = tcu::RGBA::getBlue(&local_4c);
          iVar4 = tcu::RGBA::getBlue((RGBA *)((long)&log_local + 4));
          bVar7 = true;
          if (iVar5 == iVar4) {
            local_50 = tcu::Surface::getPixel(pSStack_30,local_40,local_3c);
            iVar5 = tcu::RGBA::getAlpha(&local_50);
            iVar4 = tcu::RGBA::getAlpha((RGBA *)((long)&log_local + 4));
            bVar7 = iVar5 != iVar4;
          }
        }
      }
      if (bVar7) {
        x._3_1_ = 0;
      }
    }
  }
  if (((x._3_1_ & 1) == 0) || (y == 0)) {
    if ((x._3_1_ & 1) == 0) {
      tcu::TestLog::operator<<
                (&local_1d0,(TestLog *)imageSetName_local,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      this = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [24])"Image comparison failed");
      tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    }
    pcVar3 = imageSetName_local;
    pcVar2 = imageSetDesc_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar2,&local_241);
    pSVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)pSVar1,&local_269);
    tcu::LogImageSet::LogImageSet(&local_220,&local_240,&local_268);
    pTVar6 = tcu::TestLog::operator<<((TestLog *)pcVar3,&local_220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Result",&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_349);
    tcu::LogImage::LogImage
              (&local_300,&local_320,&local_348,pSStack_30,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_300);
    tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_300);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    tcu::LogImageSet::~LogImageSet(&local_220);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
  }
  else if (y == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,pcVar2,&local_3b1);
    pSVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,(char *)pSVar1,&local_3d9);
    tcu::LogImageSet::LogImageSet(&local_390,&local_3b0,&local_3d8);
    pTVar6 = tcu::TestLog::operator<<((TestLog *)pcVar3,&local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Result",&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Result",&local_4b9);
    tcu::LogImage::LogImage
              (&local_470,&local_490,&local_4b8,pSStack_30,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_470);
    tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_470);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    tcu::LogImageSet::~LogImageSet(&local_390);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
  }
  return (bool)(x._3_1_ & 1);
}

Assistant:

static bool compareToConstantColor (TestLog& log, const char* imageSetName, const char* imageSetDesc, const tcu::Surface& result, tcu::CompareLogMode logMode, RGBA color)
{
	bool isOk = true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			if (result.getPixel(x, y).getRed()		!= color.getRed()	||
				result.getPixel(x, y).getGreen()	!= color.getGreen() ||
				result.getPixel(x, y).getBlue()		!= color.getBlue()	||
				result.getPixel(x, y).getAlpha()	!= color.getAlpha())
			{
				isOk = false;
			}
		}
	}

	if (!isOk || logMode == tcu::COMPARE_LOG_EVERYTHING)
	{
		if (!isOk)
			log << TestLog::Message << "Image comparison failed" << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;
	}
	else if (logMode == tcu::COMPARE_LOG_RESULT)
		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::EndImageSet;

	return isOk;
}